

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::f_formatter<spdlog::details::null_scoped_padder>::format
          (f_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  ulong value;
  int iVar3;
  ulong uVar4;
  long lVar5;
  format_int local_40;
  
  lVar5 = (msg->time).__d.__r;
  value = (lVar5 / 1000000000) * -1000000 + lVar5 / 1000;
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar1 = (uint)*(ushort *)(fmt::v7::detail::bsr2log10(int)::data + (uint)((int)lVar5 * 2)) -
          (uint)(value < *(ulong *)(fmt::v7::detail::basic_data<void>::zero_or_powers_of_10_64_new +
                                   (ulong)*(ushort *)
                                           (fmt::v7::detail::bsr2log10(int)::data +
                                           (uint)((int)lVar5 * 2)) * 8));
  if (uVar1 < 6) {
    iVar3 = 6 - uVar1;
    do {
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar4) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar2 = (dest->super_buffer<char>).size_;
        uVar4 = sVar2 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar4;
      (dest->super_buffer<char>).ptr_[sVar2] = '0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  local_40.str_ = fmt::v7::format_int::format_unsigned<unsigned_long>(&local_40,value);
  lVar5 = (long)&local_40 - (long)local_40.str_;
  if (-0x16 < lVar5) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_40.str_,local_40.str_ + lVar5 + 0x15);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }